

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::UninterpretedOption::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[3]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 4));
    RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
               &self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x3205,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void UninterpretedOption::SharedDtor(MessageLite& self) {
  UninterpretedOption& this_ = static_cast<UninterpretedOption&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.identifier_value_.Destroy();
  this_._impl_.string_value_.Destroy();
  this_._impl_.aggregate_value_.Destroy();
  this_._impl_.~Impl_();
}